

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O3

_Bool math_tan(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double __x;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  gravity_class_t *pgVar2;
  gravity_value_t value;
  
  pgVar2 = args[1].isa;
  __x = (double)args[1].field_1.n;
  if (pgVar2 == gravity_class_null && __x == 0.0) {
    aVar1.n = 0;
    pgVar2 = gravity_class_int;
  }
  else if (pgVar2 == gravity_class_int) {
    aVar1.f = tan((double)(long)__x);
    pgVar2 = gravity_class_float;
  }
  else if (pgVar2 == gravity_class_float) {
    aVar1.f = tan(__x);
    pgVar2 = gravity_class_float;
  }
  else {
    aVar1.n = 1;
    pgVar2 = gravity_class_null;
  }
  value.field_1.n = aVar1.n;
  value.isa = pgVar2;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_tan (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_value_t value = GET_VALUE(1);

    if (VALUE_ISA_NULL(value)) {
        RETURN_VALUE(VALUE_FROM_INT(0), rindex);
    }

    if (VALUE_ISA_INT(value)) {
        gravity_float_t computed_value = (gravity_float_t)TAN((gravity_float_t)value.n);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    if (VALUE_ISA_FLOAT(value)) {
        gravity_float_t computed_value = (gravity_float_t)TAN((gravity_float_t)value.f);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    // should be NaN
    RETURN_VALUE(VALUE_FROM_UNDEFINED, rindex);
}